

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O2

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MLNodeLaplacian::getSolvabilityOffset
          (Vector<double,_std::allocator<double>_> *__return_storage_ptr__,MLNodeLaplacian *this,
          int amrlev,int mglev,Any *a_rhs)

{
  Array4<const_double> *pAVar1;
  undefined8 *puVar2;
  LinOpBCType LVar3;
  pointer paVar4;
  pointer paVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Real RVar13;
  bool bVar14;
  int i;
  int iVar15;
  FabArray<amrex::FArrayBox> *this_00;
  EBFArrayBoxFactory *this_01;
  long lVar16;
  MultiArray4<const_double> MVar17;
  MultiArray4<const_double> MVar18;
  Array4<const_double> *pAVar19;
  FabArray<amrex::FArrayBox> *pFVar20;
  int *piVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  int i_1;
  int iVar30;
  ulong uVar31;
  long lVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  initializer_list<std::reference_wrapper<double>_> __l;
  initializer_list<double> __l_00;
  initializer_list<std::reference_wrapper<double>_> __l_01;
  initializer_list<double> __l_02;
  Type TVar35;
  ReduceOps<amrex::ReduceOpSum,_amrex::ReduceOpSum> reduce_op_1;
  Box nddom;
  double local_1d8;
  ReduceOps<amrex::ReduceOpSum,_amrex::ReduceOpSum> reduce_op;
  Box dom;
  Real s2;
  BATType BStack_140;
  BATOp BStack_13c;
  MFIter mfi;
  Real s1;
  _Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
  local_60;
  _Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
  local_48;
  
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == RAP) {
    BStack_13c._44_8_ = __return_storage_ptr__;
    this_00 = &Any::get<amrex::MultiFab>(a_rhs)->super_FabArray<amrex::FArrayBox>;
    lVar16 = **(long **)&(this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                         super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                         .
                         super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
    ;
    if ((((lVar16 == 0) ||
         (this_01 = (EBFArrayBoxFactory *)
                    __dynamic_cast(lVar16,&FabFactory<amrex::FArrayBox>::typeinfo,
                                   &EBFArrayBoxFactory::typeinfo,0), mglev != 0)) ||
        (this_01 == (EBFArrayBoxFactory *)0x0)) ||
       (bVar14 = EBFArrayBoxFactory::isAllRegular(this_01), bVar14)) {
      lVar16 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      piVar21 = (int *)(lVar16 + 0xac + (long)mglev * 200);
      uVar9 = *(undefined8 *)(piVar21 + 2);
      puVar2 = (undefined8 *)(lVar16 + 0xb8 + (long)mglev * 200);
      nddom.bigend.vect[1] = (int)((ulong)*puVar2 >> 0x20);
      nddom._20_8_ = puVar2[1];
      nddom.smallend.vect._0_8_ = *(undefined8 *)piVar21;
      nddom.smallend.vect[2] = (int)uVar9;
      nddom.bigend.vect[0] = (int)((ulong)uVar9 >> 0x20);
      for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
        if ((nddom.btype.itype >> ((uint)lVar16 & 0x1f) & 1) == 0) {
          piVar21 = nddom.bigend.vect + lVar16;
          *piVar21 = *piVar21 + 1;
        }
      }
      nddom.btype.itype = 7;
      paVar4 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               .
               super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      paVar5 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               .
               super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
        LVar3 = paVar4->_M_elems[lVar16];
        if ((LVar3 != Neumann) && (LVar3 != inflow)) {
          piVar21 = nddom.smallend.vect + lVar16;
          *piVar21 = *piVar21 + -10;
        }
        LVar3 = paVar5->_M_elems[lVar16];
        if ((LVar3 != Neumann) && (LVar3 != inflow)) {
          piVar21 = nddom.bigend.vect + lVar16;
          *piVar21 = *piVar21 + 10;
        }
      }
      pFVar20 = &(this->super_MLNodeLinOp).m_bottom_dot_mask.super_FabArray<amrex::FArrayBox>;
      if (mglev + 1 !=
          *(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start) {
        pFVar20 = &(this->super_MLNodeLinOp).m_coarse_dot_mask.super_FabArray<amrex::FArrayBox>;
      }
      MVar17 = FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>(pFVar20);
      MVar18 = FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>(this_00);
      iVar15 = nddom.bigend.vect[1];
      iVar12 = nddom.bigend.vect[0];
      iVar28 = nddom.smallend.vect[2];
      dom.smallend.vect[0] = 0;
      dom.smallend.vect[1] = 0;
      dom.smallend.vect[2] = 0;
      iVar10 = nddom.smallend.vect[0];
      iVar11 = nddom.smallend.vect[1];
      iVar26 = nddom.bigend.vect[2];
      ReduceData<double,double>::ReduceData<amrex::ReduceOpSum,amrex::ReduceOpSum>
                ((ReduceData<double,double> *)&s1,&reduce_op);
      MFIter::MFIter(&mfi,&this_00->super_FabArrayBase,true);
      while (mfi.currentIndex < mfi.endIndex) {
        MFIter::growntilebox((Box *)&s2,&mfi,&dom.smallend);
        piVar21 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar21 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        pAVar1 = MVar17.hp + *piVar21;
        pAVar19 = MVar18.hp + *piVar21;
        for (lVar16 = (long)(int)BStack_140; iVar22 = (int)lVar16,
            iVar22 <= BStack_13c.m_bndryReg.m_crse_ratio.vect[0]; lVar16 = lVar16 + 1) {
          for (lVar29 = (long)s2._4_4_; iVar24 = (int)lVar29,
              iVar24 <= (int)BStack_13c.m_bndryReg.m_typ.itype; lVar29 = lVar29 + 1) {
            for (lVar27 = (long)s2._0_4_; iVar25 = (int)lVar27,
                iVar25 <= (int)BStack_13c.m_indexType.m_typ.itype; lVar27 = lVar27 + 1) {
              uVar33 = 0;
              uVar34 = 0x3fe00000;
              if (iVar10 != iVar25) {
                uVar33 = (undefined4)*(undefined8 *)(&DAT_00601860 + (ulong)(iVar12 == iVar25) * 8);
                uVar34 = (undefined4)
                         ((ulong)*(undefined8 *)(&DAT_00601860 + (ulong)(iVar12 == iVar25) * 8) >>
                         0x20);
              }
              dVar7 = (double)CONCAT44(uVar34,uVar33);
              if (iVar15 == iVar24 || iVar11 == iVar24) {
                dVar7 = (double)CONCAT44(uVar34,uVar33) * 0.5;
              }
              if (iVar26 == iVar22 || iVar28 == iVar22) {
                dVar7 = dVar7 * 0.5;
              }
              dVar8 = *(double *)((long)s1 + 8) +
                      pAVar1->p[((lVar16 - (pAVar1->begin).z) * pAVar1->kstride +
                                (lVar29 - (pAVar1->begin).y) * pAVar1->jstride + lVar27) -
                                (long)(pAVar1->begin).x] *
                      pAVar19->p
                      [((lVar16 - (pAVar19->begin).z) * pAVar19->kstride +
                       (lVar29 - (pAVar19->begin).y) * pAVar19->jstride + lVar27) -
                       (long)(pAVar19->begin).x];
              auVar6._8_4_ = SUB84(dVar8,0);
              auVar6._0_8_ = *(double *)s1 +
                             pAVar1->p[((lVar16 - (pAVar1->begin).z) * pAVar1->kstride +
                                       (lVar29 - (pAVar1->begin).y) * pAVar1->jstride + lVar27) -
                                       (long)(pAVar1->begin).x] * dVar7;
              auVar6._12_4_ = (int)((ulong)dVar8 >> 0x20);
              *(undefined1 (*) [16])s1 = auVar6;
            }
          }
        }
        MFIter::operator++(&mfi);
      }
      MFIter::~MFIter(&mfi);
      TVar35 = ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum>::
               value<amrex::ReduceData<double,double>>
                         ((ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum> *)&reduce_op,
                          (ReduceData<double,_double> *)&s1);
      ReduceData<double,_double>::~ReduceData((ReduceData<double,_double> *)&s1);
      mfi.fabArray = (FabArrayBase *)&s2;
      __l._M_len = 2;
      __l._M_array = (iterator)&mfi;
      s2 = (Real)TVar35.super_gpu_tuple_impl<0UL,_double,_double>.super_gpu_tuple_impl<1UL,_double>.
                 super_gpu_tuple_element<1UL,_double>.m_value.super_gpu_tuple_element<1UL,_double>;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )&s1;
      s1 = TVar35.super_gpu_tuple_impl<0UL,_double,_double>.super_gpu_tuple_element<0UL,_double>.
           m_value.m_value;
      std::vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
      ::vector((vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                *)&local_60,__l,(allocator_type *)&dom);
      std::
      _Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
      ::~_Vector_base(&local_60);
      __return_storage_ptr__ = (Vector<double,_std::allocator<double>_> *)BStack_13c._44_8_;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(s1 / s2);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&mfi;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)BStack_13c._44_8_,__l_00,
                 (allocator_type *)&dom);
    }
    else {
      pFVar20 = &EBFArrayBoxFactory::getVolFrac(this_01)->super_FabArray<amrex::FArrayBox>;
      BStack_13c._20_8_ = FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>(pFVar20);
      lVar16 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                         super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[amrlev].
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      dom.bigend.vect[1] = (int)((ulong)*(undefined8 *)(lVar16 + 0xb8) >> 0x20);
      dom._20_8_ = *(undefined8 *)(lVar16 + 0xc0);
      dom.smallend.vect._0_8_ = *(undefined8 *)(lVar16 + 0xac);
      dom.smallend.vect[2] = (int)*(undefined8 *)(lVar16 + 0xb4);
      dom.bigend.vect[0] = (int)((ulong)*(undefined8 *)(lVar16 + 0xb4) >> 0x20);
      paVar4 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               .
               super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      paVar5 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               .
               super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
        LVar3 = paVar4->_M_elems[lVar16];
        if ((LVar3 != Neumann) && (LVar3 != inflow)) {
          piVar21 = dom.smallend.vect + lVar16;
          *piVar21 = *piVar21 + -10;
        }
        LVar3 = paVar5->_M_elems[lVar16];
        if ((LVar3 != Neumann) && (LVar3 != inflow)) {
          piVar21 = dom.bigend.vect + lVar16;
          *piVar21 = *piVar21 + 10;
        }
      }
      pFVar20 = &(this->super_MLNodeLinOp).m_bottom_dot_mask.super_FabArray<amrex::FArrayBox>;
      if (*(this->super_MLNodeLinOp).super_MLLinOp.m_num_mg_levels.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start != 1) {
        pFVar20 = &(this->super_MLNodeLinOp).m_coarse_dot_mask.super_FabArray<amrex::FArrayBox>;
      }
      MVar17 = FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>(pFVar20);
      BStack_13c._36_8_ = FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>(this_00);
      _reduce_op = 0;
      BStack_13c.m_bndryReg.m_typ.itype = (IndexType)(IndexType)dom.bigend.vect[1];
      BStack_13c.m_bndryReg.m_crse_ratio.vect[0] = dom.bigend.vect[2];
      BStack_13c.m_bndryReg.m_crse_ratio.vect[1] = dom.btype.itype;
      s2 = (Real)dom.smallend.vect._0_8_;
      BStack_140 = dom.smallend.vect[2];
      BStack_13c.m_indexType.m_typ.itype = (BATindexType)(BATindexType)dom.bigend.vect[0];
      BStack_13c._28_8_ = MVar17;
      ReduceData<double,double>::ReduceData<amrex::ReduceOpSum,amrex::ReduceOpSum>
                ((ReduceData<double,double> *)&s1,&reduce_op_1);
      MFIter::MFIter(&mfi,&this_00->super_FabArrayBase,true);
      while (mfi.currentIndex < mfi.endIndex) {
        MFIter::growntilebox(&nddom,&mfi,(IntVect *)&reduce_op);
        RVar13 = s1;
        iVar11 = nddom.bigend.vect[1];
        iVar10 = nddom.bigend.vect[0];
        piVar21 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar21 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        lVar16 = (long)*piVar21;
        BStack_13c._60_8_ = nddom.smallend.vect._0_8_ & 0xffffffff;
        BStack_13c._52_8_ = ZEXT48((uint)nddom.smallend.vect[1]);
        iVar12 = nddom.bigend.vect[2];
        iVar26 = nddom.smallend.vect[2] + -1;
        iVar22 = nddom.smallend.vect[1] + -1;
        iVar15 = nddom.smallend.vect[0] + -1;
        for (iVar28 = nddom.smallend.vect[2]; iVar28 <= iVar12; iVar28 = iVar28 + 1) {
          uVar31 = BStack_13c._52_8_ & 0xffffffff;
          iVar24 = iVar22;
          while (iVar25 = (int)uVar31, iVar25 <= iVar11) {
            uVar31 = BStack_13c._60_8_ & 0xffffffff;
            iVar23 = iVar15;
            while (iVar30 = (int)uVar31, iVar30 <= iVar10) {
              local_1d8 = 0.0;
              for (lVar29 = (long)iVar26; lVar27 = (long)iVar24, (int)lVar29 <= iVar28;
                  lVar29 = lVar29 + 1) {
                for (; lVar32 = (long)iVar23, (int)lVar27 <= iVar25; lVar27 = lVar27 + 1) {
                  for (; (int)lVar32 <= iVar30; lVar32 = lVar32 + 1) {
                    bVar14 = Box::contains((Box *)&s2,(int)lVar32,(int)lVar27,(int)lVar29);
                    if (bVar14) {
                      local_1d8 = local_1d8 +
                                  ((Array4<const_double> *)(BStack_13c._20_8_ + lVar16 * 0x40))->p
                                  [((lVar29 - ((int *)(BStack_13c._20_8_ + 0x28))[lVar16 * 0x10]) *
                                    ((Long *)(BStack_13c._20_8_ + 0x10))[lVar16 * 8] +
                                   (lVar27 - ((int *)(BStack_13c._20_8_ + 0x24))[lVar16 * 0x10]) *
                                   ((Long *)(BStack_13c._20_8_ + 8))[lVar16 * 8] + lVar32) -
                                   (long)*(int *)((long)(BStack_13c._20_8_ + 0x20) + lVar16 * 0x40)]
                                  * 0.125;
                    }
                  }
                }
              }
              lVar29 = lVar16 * 0x40;
              dVar7 = ((Array4<const_double> *)(BStack_13c._36_8_ + lVar29))->p
                      [((long)iVar25 - (long)((int *)(BStack_13c._36_8_ + 0x24))[lVar16 * 0x10]) *
                       ((Long *)(BStack_13c._36_8_ + 8))[lVar16 * 8] +
                       ((long)iVar30 - (long)*(int *)((long)(BStack_13c._36_8_ + 0x20) + lVar29)) +
                       ((long)iVar28 - (long)((int *)(BStack_13c._36_8_ + 0x28))[lVar16 * 0x10]) *
                       ((Long *)(BStack_13c._36_8_ + 0x10))[lVar16 * 8]];
              dVar8 = ((Array4<const_double> *)(BStack_13c._28_8_ + lVar29))->p
                      [((long)iVar25 - (long)((int *)(BStack_13c._28_8_ + 0x24))[lVar16 * 0x10]) *
                       ((Long *)(BStack_13c._28_8_ + 8))[lVar16 * 8] +
                       ((long)iVar30 - (long)*(int *)((long)(BStack_13c._28_8_ + 0x20) + lVar29)) +
                       ((long)iVar28 - (long)((int *)(BStack_13c._28_8_ + 0x28))[lVar16 * 0x10]) *
                       ((Long *)(BStack_13c._28_8_ + 0x10))[lVar16 * 8]];
              *(double *)RVar13 = *(double *)RVar13 + dVar8 * local_1d8;
              *(double *)((long)RVar13 + 8) = *(double *)((long)RVar13 + 8) + dVar8 * dVar7;
              iVar23 = iVar23 + 1;
              uVar31 = (ulong)(iVar30 + 1);
            }
            iVar24 = iVar24 + 1;
            uVar31 = (ulong)(iVar25 + 1);
          }
          iVar26 = iVar26 + 1;
        }
        MFIter::operator++(&mfi);
      }
      MFIter::~MFIter(&mfi);
      TVar35 = ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum>::
               value<amrex::ReduceData<double,double>>
                         ((ReduceOps<amrex::ReduceOpSum,amrex::ReduceOpSum> *)&reduce_op_1,
                          (ReduceData<double,_double> *)&s1);
      ReduceData<double,_double>::~ReduceData((ReduceData<double,_double> *)&s1);
      __l_01._M_len = 2;
      __l_01._M_array = (iterator)&mfi;
      s2 = (Real)TVar35.super_gpu_tuple_impl<0UL,_double,_double>.super_gpu_tuple_impl<1UL,_double>.
                 super_gpu_tuple_element<1UL,_double>.m_value.super_gpu_tuple_element<1UL,_double>;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )&s1;
      mfi.fabArray = (FabArrayBase *)&s2;
      s1 = TVar35.super_gpu_tuple_impl<0UL,_double,_double>.super_gpu_tuple_element<0UL,_double>.
           m_value.m_value;
      std::vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
      ::vector((vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
                *)&local_48,__l_01,(allocator_type *)&nddom);
      std::
      _Vector_base<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
      ::~_Vector_base(&local_48);
      __return_storage_ptr__ = (Vector<double,_std::allocator<double>_> *)BStack_13c._44_8_;
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(s1 / s2);
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&mfi;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)BStack_13c._44_8_,__l_02,
                 (allocator_type *)&nddom);
    }
  }
  else {
    MLNodeLinOp::getSolvabilityOffset
              (__return_storage_ptr__,&this->super_MLNodeLinOp,amrlev,mglev,a_rhs);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<Real>
MLNodeLaplacian::getSolvabilityOffset (int amrlev, int mglev, Any const& a_rhs) const
{
    amrex::ignore_unused(amrlev);
    AMREX_ASSERT(amrlev==0 && (mglev+1==m_num_mg_levels[0] || mglev==0));
    AMREX_ASSERT(getNComp() == 1);

    if (m_coarsening_strategy == CoarseningStrategy::RAP) {
        AMREX_ASSERT(a_rhs.is<MultiFab>());
        auto const& rhs = a_rhs.get<MultiFab>();

#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
        if (mglev == 0 && factory && !factory->isAllRegular()) {
            const MultiFab& vfrac = factory->getVolFrac();
            const auto& vfrac_ma = vfrac.const_arrays();

            Box dom = Geom(amrlev,mglev).Domain();
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (m_lobc[0][idim] != LinOpBCType::Neumann &&
                    m_lobc[0][idim] != LinOpBCType::inflow)
                {
                    dom.growLo(idim, 10);
                }
                if (m_hibc[0][idim] != LinOpBCType::Neumann &&
                    m_hibc[0][idim] != LinOpBCType::inflow)
                {
                    dom.growHi(idim, 10);
                }
            }

            const auto& mask = (mglev+1 == m_num_mg_levels[0]) ? m_bottom_dot_mask : m_coarse_dot_mask;
            const auto& mask_ma = mask.const_arrays();
            const auto& rhs_ma = rhs.const_arrays();
            auto r = ParReduce(TypeList<ReduceOpSum,ReduceOpSum>{}, TypeList<Real,Real>{},
                               rhs, IntVect(0),
                               [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                               -> GpuTuple<Real,Real>
                               {
                                   Real scale = 0.0_rt;
#if (AMREX_SPACEDIM == 3)
                                   int const koff = 1;
                                   Real const fac = 0.125_rt;
#else
                                   int const koff = 0;
                                   Real const fac = 0.25_rt;
#endif
                                   for (int kc = k-koff; kc <= k; ++kc) {
                                   for (int jc = j-1   ; jc <= j; ++jc) {
                                   for (int ic = i-1   ; ic <= i; ++ic) {
                                       if (dom.contains(ic,jc,kc)) {
                                           scale += vfrac_ma[box_no](ic,jc,kc) * fac;
                                       }
                                   }}}
                                   return { mask_ma[box_no](i,j,k) * rhs_ma[box_no](i,j,k),
                                            mask_ma[box_no](i,j,k) * scale };
                               });

            Real s1 = amrex::get<0>(r);
            Real s2 = amrex::get<1>(r);
            ParallelAllReduce::Sum<Real>({s1,s2}, ParallelContext::CommunicatorSub());
            return {s1/s2};
        } else
#endif
        {
            Box nddom = amrex::surroundingNodes(Geom(amrlev,mglev).Domain());
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (m_lobc[0][idim] != LinOpBCType::Neumann &&
                    m_lobc[0][idim] != LinOpBCType::inflow)
                {
                    nddom.growLo(idim, 10); // so that the test in ParReduce will faill
                }
                if (m_hibc[0][idim] != LinOpBCType::Neumann &&
                    m_hibc[0][idim] != LinOpBCType::inflow)
                {
                    nddom.growHi(idim, 10);
                }
            }

            const auto& mask = (mglev+1 == m_num_mg_levels[0]) ? m_bottom_dot_mask : m_coarse_dot_mask;
            const auto& mask_ma = mask.const_arrays();
            const auto& rhs_ma = rhs.const_arrays();
            auto r = ParReduce(TypeList<ReduceOpSum,ReduceOpSum>{}, TypeList<Real,Real>{},
                               rhs, IntVect(0),
                               [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                                   -> GpuTuple<Real,Real>
                               {
                                   Real scale = 1.0_rt;
                                   if (i == nddom.smallEnd(0) ||
                                       i == nddom.bigEnd(0)) {
                                       scale *= 0.5_rt;
                                   }
#if (AMREX_SPACEDIM >= 2)
                                   if (j == nddom.smallEnd(1) ||
                                       j == nddom.bigEnd(1)) {
                                       scale *= 0.5_rt;
                                   }
#endif
#if (AMREX_SPACEDIM == 3)
                                   if (k == nddom.smallEnd(2) ||
                                       k == nddom.bigEnd(2)) {
                                       scale *= 0.5_rt;
                                   }
#endif
                                   return { mask_ma[box_no](i,j,k) * rhs_ma[box_no](i,j,k),
                                            mask_ma[box_no](i,j,k) * scale };
                               });

            Real s1 = amrex::get<0>(r);
            Real s2 = amrex::get<1>(r);
            ParallelAllReduce::Sum<Real>({s1,s2}, ParallelContext::CommunicatorSub());
            return {s1/s2};
        }
    } else {
        return MLNodeLinOp::getSolvabilityOffset(amrlev, mglev, a_rhs);
    }
}